

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSolution.cpp
# Opt level: O2

bool getComplementarityViolations
               (HighsLp *lp,HighsSolution *solution,double *max_complementarity_violation,
               double *sum_complementarity_violations)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  int iVar4;
  pointer pdVar5;
  pointer pdVar6;
  pointer pdVar7;
  pointer pdVar8;
  double *pdVar9;
  ulong uVar10;
  double *pdVar11;
  double *pdVar12;
  double *pdVar13;
  uint uVar14;
  ulong uVar15;
  double *pdVar16;
  double *pdVar17;
  double *pdVar18;
  long lVar19;
  double *pdVar20;
  double dVar21;
  double dVar22;
  
  *max_complementarity_violation = INFINITY;
  *sum_complementarity_violations = INFINITY;
  bVar3 = solution->dual_valid;
  if (bVar3 == true) {
    *max_complementarity_violation = 0.0;
    *sum_complementarity_violations = 0.0;
    iVar4 = lp->num_col_;
    uVar14 = lp->num_row_ + iVar4;
    pdVar5 = (solution->row_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (solution->row_dual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar7 = (lp->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar8 = (lp->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar9 = (solution->col_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar12 = (solution->col_dual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar16 = (lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar17 = (lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar10 = 0;
    uVar15 = (ulong)uVar14;
    if ((int)uVar14 < 1) {
      uVar15 = uVar10;
    }
    for (; uVar15 != uVar10; uVar10 = uVar10 + 1) {
      lVar19 = uVar10 - (long)iVar4;
      pdVar11 = pdVar12;
      pdVar13 = pdVar17;
      pdVar18 = pdVar16;
      pdVar20 = pdVar9;
      if ((long)iVar4 <= (long)uVar10) {
        pdVar20 = pdVar5 + lVar19;
        pdVar11 = pdVar6 + lVar19;
        pdVar18 = pdVar7 + lVar19;
        pdVar13 = pdVar8 + lVar19;
      }
      dVar21 = *pdVar20;
      dVar1 = *pdVar18;
      dVar2 = *pdVar13;
      if ((-INFINITY < dVar1) || (dVar22 = 1.0, dVar2 < INFINITY)) {
        if ((dVar1 + dVar2) * 0.5 <= dVar21) {
          dVar22 = ABS(dVar2 - dVar21);
        }
        else {
          dVar22 = ABS(dVar1 - dVar21);
        }
      }
      dVar22 = ABS(*pdVar11) * dVar22;
      *sum_complementarity_violations = *sum_complementarity_violations + dVar22;
      dVar21 = *max_complementarity_violation;
      if (*max_complementarity_violation <= dVar22) {
        dVar21 = dVar22;
      }
      *max_complementarity_violation = dVar21;
      pdVar17 = pdVar17 + 1;
      pdVar16 = pdVar16 + 1;
      pdVar12 = pdVar12 + 1;
      pdVar9 = pdVar9 + 1;
    }
  }
  return bVar3;
}

Assistant:

bool getComplementarityViolations(const HighsLp& lp,
                                  const HighsSolution& solution,
                                  double& max_complementarity_violation,
                                  double& sum_complementarity_violations) {
  max_complementarity_violation = kHighsIllegalComplementarityViolation;
  sum_complementarity_violations = kHighsIllegalComplementarityViolation;
  if (!solution.dual_valid) return false;

  max_complementarity_violation = 0;
  sum_complementarity_violations = 0;
  double primal_residual = 0;
  for (HighsInt iVar = 0; iVar < lp.num_col_ + lp.num_row_; iVar++) {
    const bool is_col = iVar < lp.num_col_;
    const HighsInt iRow = iVar - lp.num_col_;
    const double primal =
        is_col ? solution.col_value[iVar] : solution.row_value[iRow];
    const double dual =
        is_col ? solution.col_dual[iVar] : solution.row_dual[iRow];
    const double lower = is_col ? lp.col_lower_[iVar] : lp.row_lower_[iRow];
    const double upper = is_col ? lp.col_upper_[iVar] : lp.row_upper_[iRow];
    if (lower <= -kHighsInf && upper >= kHighsInf) {
      // Free
      primal_residual = 1;
    } else {
      const double mid = (lower + upper) * 0.5;
      primal_residual =
          primal < mid ? std::fabs(lower - primal) : std::fabs(upper - primal);
    }
    const double dual_residual = std::fabs(dual);
    const double complementarity_violation = primal_residual * dual_residual;
    sum_complementarity_violations += complementarity_violation;
    max_complementarity_violation =
        std::max(complementarity_violation, max_complementarity_violation);
  }
  return true;
}